

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<8,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  float *pfVar8;
  int row_3;
  int *piVar9;
  int row_2;
  undefined8 *puVar10;
  int col_1;
  float *pfVar11;
  int col;
  undefined4 uVar12;
  float local_1a0 [14];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  int local_98 [6];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  int iStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_168;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar7) = uVar12;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar5 = lVar5 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_168 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_160 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_158 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_150 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_148 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_140 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_138 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_130 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    puVar1 = &local_168;
    local_138 = 0;
    uStack_130 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar5 * 4) = *(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  local_98[1] = (int)uStack_150;
  local_98[2] = (int)((ulong)uStack_150 >> 0x20);
  puVar4 = &uStack_74;
  local_98[0] = local_158._4_4_;
  local_98[3] = local_148._4_4_;
  local_98[4] = (undefined4)uStack_140;
  local_98[5] = uStack_140._4_4_;
  uStack_80 = local_138._4_4_;
  uStack_7c = (undefined4)uStack_130;
  local_78 = uStack_130._4_4_;
  uStack_74 = local_168._4_4_;
  uStack_70 = (undefined4)uStack_160;
  uStack_6c = uStack_160._4_4_;
  local_68 = local_148._4_4_;
  uStack_64 = (undefined4)uStack_140;
  uStack_60 = uStack_140._4_4_;
  uStack_5c = local_138._4_4_;
  puVar6 = &uStack_50;
  local_58 = (undefined4)uStack_130;
  uStack_54 = uStack_130._4_4_;
  uStack_50 = local_168._4_4_;
  uStack_4c = (undefined4)uStack_160;
  local_48 = uStack_160._4_4_;
  iStack_44 = local_158._4_4_;
  uStack_40 = local_98[1];
  uStack_3c = local_98[2];
  puVar2 = &uStack_2c;
  local_38 = local_138._4_4_;
  uStack_34 = (undefined4)uStack_130;
  uStack_30 = uStack_130._4_4_;
  uStack_2c = local_168._4_4_;
  local_28 = (undefined4)uStack_160;
  uStack_24 = uStack_160._4_4_;
  iStack_20 = local_158._4_4_;
  uStack_1c = local_98[1];
  local_18 = local_98[2];
  uStack_14 = local_148._4_4_;
  uStack_10 = (undefined4)uStack_140;
  uStack_c = uStack_140._4_4_;
  pfVar8 = local_1a0 + 2;
  local_1a0[6] = 0.0;
  local_1a0[7] = 0.0;
  local_1a0[8] = 0.0;
  local_1a0[9] = 0.0;
  local_1a0[2] = 0.0;
  local_1a0[3] = 0.0;
  local_1a0[4] = 0.0;
  local_1a0[5] = 0.0;
  local_1a0[10] = 0.0;
  piVar9 = local_98;
  lVar3 = 0;
  do {
    lVar5 = 0;
    pfVar11 = pfVar8;
    do {
      *pfVar11 = (float)piVar9[lVar5];
      lVar5 = lVar5 + 1;
      pfVar11 = pfVar11 + 3;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    pfVar8 = pfVar8 + 1;
    piVar9 = piVar9 + 3;
  } while (lVar3 != 3);
  puVar1 = &local_c8;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_a8 = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    puVar10 = puVar1;
    do {
      *(undefined4 *)puVar10 = puVar4[lVar5];
      lVar5 = lVar5 + 1;
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar4 = puVar4 + 3;
  } while (lVar3 != 3);
  puVar1 = &local_f8;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_d8 = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    puVar10 = puVar1;
    do {
      *(undefined4 *)puVar10 = puVar6[lVar5];
      lVar5 = lVar5 + 1;
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar6 = puVar6 + 3;
  } while (lVar3 != 3);
  puVar1 = &local_128;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_108 = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    puVar10 = puVar1;
    do {
      *(undefined4 *)puVar10 = puVar2[lVar5];
      lVar5 = lVar5 + 1;
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 3;
  } while (lVar3 != 3);
  local_1a0[3] = (((float)local_168 *
                   ((((local_1a0[8] * local_1a0[3] * local_1a0[7] +
                      local_1a0[2] * local_1a0[6] * local_1a0[10] +
                      local_1a0[5] * local_1a0[9] * local_1a0[4]) -
                     local_1a0[9] * local_1a0[2] * local_1a0[7]) -
                    local_1a0[3] * local_1a0[5] * local_1a0[10]) -
                   local_1a0[6] * local_1a0[8] * local_1a0[4]) -
                  (((((float)uStack_b0 * local_c8._4_4_ * local_b8._4_4_ +
                     (float)local_c8 * (float)local_b8 * local_a8 +
                     uStack_c0._4_4_ * uStack_b0._4_4_ * (float)uStack_c0) -
                    uStack_b0._4_4_ * (float)local_c8 * local_b8._4_4_) -
                   local_c8._4_4_ * uStack_c0._4_4_ * local_a8) -
                  (float)local_b8 * (float)uStack_b0 * (float)uStack_c0) * (float)local_158) +
                 (float)local_148 *
                 (((((float)uStack_e0 * local_f8._4_4_ * local_e8._4_4_ +
                    (float)local_f8 * (float)local_e8 * local_d8 +
                    uStack_f0._4_4_ * uStack_e0._4_4_ * (float)uStack_f0) -
                   uStack_e0._4_4_ * (float)local_f8 * local_e8._4_4_) -
                  local_f8._4_4_ * uStack_f0._4_4_ * local_d8) -
                 (float)local_e8 * (float)uStack_e0 * (float)uStack_f0)) -
                 (float)local_138 *
                 (((((float)uStack_110 * local_128._4_4_ * local_118._4_4_ +
                    (float)local_128 * (float)local_118 * local_108 +
                    uStack_120._4_4_ * uStack_110._4_4_ * (float)uStack_120) -
                   uStack_110._4_4_ * (float)local_128 * local_118._4_4_) -
                  local_128._4_4_ * uStack_120._4_4_ * local_108) -
                 (float)local_118 * (float)uStack_110 * (float)uStack_120);
  local_1a0[2] = local_1a0[3];
  local_1a0[4] = local_1a0[3];
  local_98[2] = 0;
  local_98[3] = 1;
  local_98[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_98[lVar3]] = local_1a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}